

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

PyObject * PyInit_cmake_example(void)

{
  int iVar1;
  char *__s1;
  PyObject **ppPVar2;
  error_already_set *e;
  exception *e_1;
  handle local_30;
  module_ m;
  size_t len;
  char *runtime_ver;
  char *compiled_ver;
  
  __s1 = (char *)Py_GetVersion();
  m.super_object.super_handle.m_ptr = (object)strlen("3.10");
  iVar1 = strncmp(__s1,"3.10",(size_t)m.super_object.super_handle.m_ptr);
  if ((iVar1 == 0) &&
     ((__s1[(long)m.super_object.super_handle.m_ptr] < '0' ||
      ('9' < __s1[(long)m.super_object.super_handle.m_ptr])))) {
    pybind11::detail::get_internals();
    pybind11::module_::create_extension_module
              ((module_ *)&local_30,"cmake_example",(char *)0x0,&pybind11_module_def_cmake_example);
    pybind11_init_cmake_example((module_ *)&local_30);
    ppPVar2 = pybind11::handle::ptr(&local_30);
    compiled_ver = (char *)*ppPVar2;
    pybind11::module_::~module_((module_ *)&local_30);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    compiled_ver = (char *)0x0;
  }
  return (PyObject *)compiled_ver;
}

Assistant:

PYBIND11_MODULE(cmake_example, m) {
    m.doc() = R"pbdoc(
        Pybind11 example plugin
        -----------------------

        .. currentmodule:: cmake_example

        .. autosummary::
           :toctree: _generate

           add
           subtract
    )pbdoc";

    m.def("add", &add, R"pbdoc(
        Add two numbers

        Some other explanation about the add function.
    )pbdoc");

    m.def("subtract", [](int i, int j) { return i - j; }, R"pbdoc(
        Subtract two numbers

        Some other explanation about the subtract function.
    )pbdoc");

#ifdef VERSION_INFO
    m.attr("__version__") = MACRO_STRINGIFY(VERSION_INFO);
#else
    m.attr("__version__") = "dev";
#endif
}